

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::Generator::ModuleLevelMessageName_abi_cxx11_
          (string *__return_storage_ptr__,Generator *this,Descriptor *descriptor)

{
  FileDescriptor *pFVar1;
  DescriptorStringView this_00;
  char *in_R8;
  string_view filename;
  string_view separator;
  AlphaNum local_128;
  AlphaNum local_f8;
  undefined1 local_c8 [16];
  string local_b8;
  AlphaNum local_98;
  AlphaNum local_68;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  undefined1 local_21;
  Descriptor *local_20;
  Descriptor *descriptor_local;
  Generator *this_local;
  string *name;
  
  local_21 = 0;
  local_20 = descriptor;
  descriptor_local = (Descriptor *)this;
  this_local = (Generator *)__return_storage_ptr__;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,".");
  separator._M_str = in_R8;
  separator._M_len = (size_t)local_38._M_str;
  NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
            (__return_storage_ptr__,(python *)descriptor,(Descriptor *)local_38._M_len,separator);
  pFVar1 = Descriptor::file(local_20);
  if (pFVar1 != this->file_) {
    pFVar1 = Descriptor::file(local_20);
    this_00 = FileDescriptor::name_abi_cxx11_(pFVar1);
    local_c8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    filename._M_len = local_c8._8_8_;
    filename._M_str = (char *)this;
    (anonymous_namespace)::ModuleAlias_abi_cxx11_(&local_b8,local_c8._0_8_,filename);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_98,&local_b8);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_f8,".");
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_128,__return_storage_ptr__);
    absl::lts_20240722::StrCat_abi_cxx11_(&local_68,&local_98,&local_f8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::ModuleLevelMessageName(
    const Descriptor& descriptor) const {
  std::string name = NamePrefixedWithNestedTypes(descriptor, ".");
  if (descriptor.file() != file_) {
    name = absl::StrCat(ModuleAlias(descriptor.file()->name()), ".", name);
  }
  return name;
}